

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_api.cpp
# Opt level: O0

void __thiscall cppcms::impl::cgi::http::async_read_eof(http *this,callback *h)

{
  http *this_00;
  weak_http_ptr *in_RDI;
  ignore_binder cb;
  shared_ptr<cppcms::impl::cgi::http> *in_stack_ffffffffffffff48;
  weak_ptr<cppcms::impl::cgi::http> *in_stack_ffffffffffffff50;
  mutable_buffer *this_01;
  http_watchdog *this_02;
  undefined1 *n;
  ignore_binder *in_stack_ffffffffffffff78;
  callback<void_(const_std::error_code_&,_unsigned_long)> *in_stack_ffffffffffffff80;
  callback local_78 [72];
  
  this_00 = (http *)std::
                    __shared_ptr_access<cppcms::impl::cgi::http_watchdog,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<cppcms::impl::cgi::http_watchdog,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x4995e0);
  this_02 = (http_watchdog *)&stack0xffffffffffffffd0;
  self(this_00);
  n = &stack0xffffffffffffffe0;
  std::weak_ptr<cppcms::impl::cgi::http>::weak_ptr<cppcms::impl::cgi::http,void>
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  http_watchdog::add(this_02,in_RDI);
  std::weak_ptr<cppcms::impl::cgi::http>::~weak_ptr((weak_ptr<cppcms::impl::cgi::http> *)0x499631);
  std::shared_ptr<cppcms::impl::cgi::http>::~shared_ptr
            ((shared_ptr<cppcms::impl::cgi::http> *)0x49963e);
  booster::callback<void_()>::callback
            ((callback<void_()> *)in_stack_ffffffffffffff50,
             (callback<void_()> *)in_stack_ffffffffffffff48);
  this_01 = (mutable_buffer *)(in_RDI + 0x10);
  booster::aio::buffer(in_stack_ffffffffffffff78,(size_t)n);
  ignore_binder::ignore_binder((ignore_binder *)this_01,(ignore_binder *)in_stack_ffffffffffffff48);
  booster::callback<void_(const_std::error_code_&,_unsigned_long)>::
  callback<cppcms::impl::cgi::http::ignore_binder>
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  booster::aio::stream_socket::async_read_some(this_01,local_78);
  booster::callback<void_(const_std::error_code_&,_unsigned_long)>::~callback
            ((callback<void_(const_std::error_code_&,_unsigned_long)> *)0x4996ba);
  ignore_binder::~ignore_binder((ignore_binder *)0x4996c4);
  booster::aio::mutable_buffer::~mutable_buffer((mutable_buffer *)0x4996ce);
  ignore_binder::~ignore_binder((ignore_binder *)0x4996d8);
  return;
}

Assistant:

virtual void async_read_eof(callback const &h)
		{
			watchdog_->add(self());
			static char a;
			ignore_binder cb = { h };
			socket_.async_read_some(io::buffer(&a,1),cb);
		}